

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O0

string * __thiscall
spirv_cross::join<char,unsigned_int&,char,char_const(&)[2]>
          (string *__return_storage_ptr__,spirv_cross *this,char *ts,uint *ts_1,char *ts_2,
          char (*ts_3) [2])

{
  undefined1 local_1120 [8];
  StringStream<4096UL,_4096UL> stream;
  char (*ts_local_3) [2];
  char *ts_local_2;
  uint *ts_local_1;
  char *ts_local;
  
  stream.saved_buffers.stack_storage.aligned_char._184_8_ = ts_2;
  StringStream<4096UL,_4096UL>::StringStream((StringStream<4096UL,_4096UL> *)local_1120);
  inner::join_helper<char,unsigned_int&,char,char_const(&)[2]>
            ((StringStream<4096UL,_4096UL> *)local_1120,(char *)this,(uint *)ts,(char *)ts_1,
             (char (*) [2])stream.saved_buffers.stack_storage.aligned_char._184_8_);
  StringStream<4096ul,4096ul>::str_abi_cxx11_
            (__return_storage_ptr__,(StringStream<4096ul,4096ul> *)local_1120);
  StringStream<4096UL,_4096UL>::~StringStream((StringStream<4096UL,_4096UL> *)local_1120);
  return __return_storage_ptr__;
}

Assistant:

std::string join(Ts &&... ts)
{
	StringStream<> stream;
	inner::join_helper(stream, std::forward<Ts>(ts)...);
	return stream.str();
}